

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

void __thiscall
kj::
Table<kj::TreeMap<int,_kj::StringPtr>::Entry,_kj::TreeIndex<kj::TreeMap<int,_kj::StringPtr>::Callbacks>_>
::Table(Table<kj::TreeMap<int,_kj::StringPtr>::Entry,_kj::TreeIndex<kj::TreeMap<int,_kj::StringPtr>::Callbacks>_>
        *this)

{
  Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *this_local;
  
  Vector<kj::TreeMap<int,_kj::StringPtr>::Entry>::Vector
            ((Vector<kj::TreeMap<int,_kj::StringPtr>::Entry> *)this);
  TreeIndex<kj::TreeMap<int,_kj::StringPtr>::Callbacks>::TreeIndex
            ((TreeIndex<kj::TreeMap<int,_kj::StringPtr>::Callbacks> *)(this + 0x20));
  return;
}

Assistant:

Table<Row, Indexes...>::Table() {}